

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hexdumper.h
# Opt level: O0

int Hex::Hexdumper<unsigned_char>::count_identical_lines(uchar *first,uchar *last,int unitsperline)

{
  bool bVar1;
  uchar **ppuVar2;
  undefined1 local_70 [8];
  pair<const_unsigned_char_*,_const_unsigned_char_*> thisline;
  uchar *local_58;
  uchar *pend_1;
  undefined1 auStack_48 [4];
  int count;
  pair<const_unsigned_char_*,_const_unsigned_char_*> firstline;
  uchar *local_30;
  uchar *pend;
  uchar *p;
  uchar *puStack_18;
  int unitsperline_local;
  uchar *last_local;
  uchar *first_local;
  
  firstline.second = first + unitsperline;
  pend = first;
  p._4_4_ = unitsperline;
  puStack_18 = last;
  last_local = first;
  ppuVar2 = std::min<unsigned_char_const*>(&stack0xffffffffffffffe8,&firstline.second);
  local_30 = *ppuVar2;
  _auStack_48 = std::make_pair<unsigned_char_const*&,unsigned_char_const*&>(&pend,&local_30);
  pend_1._4_4_ = 1;
  pend = local_30;
  while( true ) {
    if (puStack_18 <= pend) {
      return pend_1._4_4_;
    }
    thisline.second = pend + p._4_4_;
    ppuVar2 = std::min<unsigned_char_const*>(&stack0xffffffffffffffe8,&thisline.second);
    local_58 = *ppuVar2;
    _local_70 = std::make_pair<unsigned_char_const*&,unsigned_char_const*&>(&pend,&local_58);
    bVar1 = data_is_equal<std::pair<unsigned_char_const*,unsigned_char_const*>>
                      ((pair<const_unsigned_char_*,_const_unsigned_char_*> *)auStack_48,
                       (pair<const_unsigned_char_*,_const_unsigned_char_*> *)local_70);
    if (!bVar1) break;
    pend_1._4_4_ = pend_1._4_4_ + 1;
    pend = local_58;
  }
  return pend_1._4_4_;
}

Assistant:

static int count_identical_lines(const T*first, const T*last, int unitsperline)
    {
        auto p = first;
        auto pend = std::min(last, p+unitsperline);
        auto firstline = std::make_pair(p, pend);

        int count = 1;

        p = pend;
        while (p<last) {
            auto pend = std::min(last, p+unitsperline);
            auto thisline = std::make_pair(p, pend);

            if (!data_is_equal(firstline, thisline))
                break;

            count++;

            p = pend;
        }

        return count;
    }